

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cose.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::cose::Sign1Message::AddAttribute
          (Error *__return_storage_ptr__,Sign1Message *this,int key,int value,int flags)

{
  char cVar1;
  cn_cbor *value_00;
  char *from;
  char *to;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  writer write;
  string local_a8;
  undefined1 local_88 [8];
  char *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  parse_func local_60 [1];
  undefined1 local_58 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  value_00 = cn_cbor_int_create((long)value,(cn_cbor_errback *)0x0);
  if (value_00 == (cn_cbor *)0x0) {
    local_88._0_4_ = none_type;
    local_80 = "add COSE SIGN1 message attribute";
    local_78 = 0x20;
    local_70._M_allocated_capacity = 0;
    local_60[0] = (parse_func)0x0;
    from = "add COSE SIGN1 message attribute";
    write.handler_ = (format_string_checker<char> *)local_88;
    local_70._8_8_ = (format_string_checker<char> *)local_88;
    while (from != "") {
      cVar1 = *from;
      to = from;
      while (cVar1 != '{') {
        to = to + 1;
        if (to == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,from,"");
          goto LAB_001a6af4;
        }
        cVar1 = *to;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,from,to);
      from = ::fmt::v10::detail::
             parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                       (to,"",(format_string_checker<char> *)local_88);
    }
LAB_001a6af4:
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_88;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_a8,(v10 *)"add COSE SIGN1 message attribute",(string_view)ZEXT816(0x20),args);
    local_58._0_4_ = kOutOfMemory;
    std::__cxx11::string::string((string *)(local_58 + 8),(string *)&local_a8);
    Error::operator=(__return_storage_ptr__,(Error *)local_58);
    std::__cxx11::string::~string((string *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    AddAttribute((Error *)local_88,this,key,value_00,flags);
    Error::operator=(__return_storage_ptr__,(Error *)local_88);
    std::__cxx11::string::~string((string *)&local_80);
    if (value_00->parent == (cn_cbor *)0x0) {
      cn_cbor_free(value_00);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error Sign1Message::AddAttribute(int key, int value, int flags)
{
    Error    error;
    cn_cbor *cbor;

    cbor = cn_cbor_int_create(value, nullptr);
    VerifyOrExit(cbor != nullptr, error = ERROR_OUT_OF_MEMORY("add COSE SIGN1 message attribute"));

    SuccessOrExit(error = AddAttribute(key, cbor, flags));

exit:
    if (cbor != nullptr && cbor->parent == nullptr)
    {
        cn_cbor_free(cbor);
    }
    return error;
}